

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O1

bool __thiscall
SafeQueueWithNotification<WriterData>::push
          (SafeQueueWithNotification<WriterData> *this,WriterData *val)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)this->m_mtx;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    bVar1 = SafeQueue<WriterData>::push(&this->super_SafeQueue<WriterData>,val);
    if (bVar1) {
      std::condition_variable::notify_one();
    }
    pthread_mutex_unlock(__mutex);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool push(const T& val) override
    {
        std::lock_guard lk(m_mtx);

        if (!SafeQueue<T>::push(val))
            return false;

        m_cond.notify_one();

        return true;
    }